

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O1

int __thiscall BezierEase::init(BezierEase *this,EVP_PKEY_CTX *ctx)

{
  QList<BezierEase::SingleCubicBezier> *this_00;
  undefined8 uVar1;
  qreal qVar2;
  bool bVar3;
  pointer pdVar4;
  pointer pSVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long in_FS_OFFSET;
  undefined4 uVar10;
  undefined4 uVar11;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.xp = 1.0;
  local_48.yp = 1.0;
  bVar3 = qFuzzyCompare((this->super_QEasingCurveFunction)._bezierCurves.d.ptr +
                        (this->super_QEasingCurveFunction)._bezierCurves.d.size + -1,&local_48);
  if (bVar3) {
    this->_init = true;
    iVar6 = (int)((ulong)(this->super_QEasingCurveFunction)._bezierCurves.d.size / 3);
    this->_curveCount = iVar6;
    bVar3 = true;
    if (0 < iVar6) {
      this_00 = &this->_curves;
      lVar9 = 0;
      lVar7 = 0;
      uVar8 = 0;
      do {
        uVar1 = *(undefined8 *)
                 ((long)&(this->super_QEasingCurveFunction)._bezierCurves.d.ptr[2].xp + lVar9);
        pdVar4 = QList<double>::data(&this->_intervals);
        *(undefined8 *)((long)pdVar4 + lVar7) = uVar1;
        if (lVar7 == 0) {
          pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
          pSVar5->p0x = 0.0;
          pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
          pSVar5->p0y = 0.0;
          qVar2 = ((this->super_QEasingCurveFunction)._bezierCurves.d.ptr)->xp;
          pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
          pSVar5->p1x = qVar2;
          qVar2 = ((this->super_QEasingCurveFunction)._bezierCurves.d.ptr)->yp;
          pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
          pSVar5->p1y = qVar2;
          qVar2 = (this->super_QEasingCurveFunction)._bezierCurves.d.ptr[1].xp;
          pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
          pSVar5->p2x = qVar2;
          qVar2 = (this->super_QEasingCurveFunction)._bezierCurves.d.ptr[1].yp;
          pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
          pSVar5->p2y = qVar2;
          qVar2 = (this->super_QEasingCurveFunction)._bezierCurves.d.ptr[2].xp;
          pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
          pSVar5->p3x = qVar2;
          qVar2 = (this->super_QEasingCurveFunction)._bezierCurves.d.ptr[2].yp;
          pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
          pSVar5->p3y = qVar2;
        }
        else {
          if (uVar8 == this->_curveCount - 1) {
            qVar2 = (this->super_QEasingCurveFunction)._bezierCurves.d.ptr
                    [(this->super_QEasingCurveFunction)._bezierCurves.d.size + -4].xp;
            pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
            (&pSVar5->p0x)[lVar7] = qVar2;
            qVar2 = (this->super_QEasingCurveFunction)._bezierCurves.d.ptr
                    [(this->super_QEasingCurveFunction)._bezierCurves.d.size + -4].yp;
            pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
            (&pSVar5->p0y)[lVar7] = qVar2;
            qVar2 = (this->super_QEasingCurveFunction)._bezierCurves.d.ptr
                    [(this->super_QEasingCurveFunction)._bezierCurves.d.size + -3].xp;
            pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
            (&pSVar5->p1x)[lVar7] = qVar2;
            qVar2 = (this->super_QEasingCurveFunction)._bezierCurves.d.ptr
                    [(this->super_QEasingCurveFunction)._bezierCurves.d.size + -3].yp;
            pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
            (&pSVar5->p1y)[lVar7] = qVar2;
            qVar2 = (this->super_QEasingCurveFunction)._bezierCurves.d.ptr
                    [(this->super_QEasingCurveFunction)._bezierCurves.d.size + -2].xp;
            pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
            (&pSVar5->p2x)[lVar7] = qVar2;
            qVar2 = (this->super_QEasingCurveFunction)._bezierCurves.d.ptr
                    [(this->super_QEasingCurveFunction)._bezierCurves.d.size + -2].yp;
            pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
            (&pSVar5->p2y)[lVar7] = qVar2;
            qVar2 = (this->super_QEasingCurveFunction)._bezierCurves.d.ptr
                    [(this->super_QEasingCurveFunction)._bezierCurves.d.size + -1].xp;
            pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
            (&pSVar5->p3x)[lVar7] = qVar2;
            qVar2 = (this->super_QEasingCurveFunction)._bezierCurves.d.ptr
                    [(this->super_QEasingCurveFunction)._bezierCurves.d.size + -1].yp;
            uVar10 = SUB84(qVar2,0);
            uVar11 = (undefined4)((ulong)qVar2 >> 0x20);
          }
          else {
            qVar2 = *(qreal *)((long)&(this->super_QEasingCurveFunction)._bezierCurves.d.ptr[-1].xp
                              + lVar9);
            pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
            (&pSVar5->p0x)[lVar7] = qVar2;
            qVar2 = *(qreal *)((long)(this->super_QEasingCurveFunction)._bezierCurves.d.ptr +
                              lVar9 + -8);
            pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
            (&pSVar5->p0y)[lVar7] = qVar2;
            qVar2 = *(qreal *)((long)&((this->super_QEasingCurveFunction)._bezierCurves.d.ptr)->xp +
                              lVar9);
            pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
            (&pSVar5->p1x)[lVar7] = qVar2;
            qVar2 = *(qreal *)((long)&((this->super_QEasingCurveFunction)._bezierCurves.d.ptr)->yp +
                              lVar9);
            pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
            (&pSVar5->p1y)[lVar7] = qVar2;
            qVar2 = *(qreal *)((long)&(this->super_QEasingCurveFunction)._bezierCurves.d.ptr[1].xp +
                              lVar9);
            pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
            (&pSVar5->p2x)[lVar7] = qVar2;
            qVar2 = *(qreal *)((long)&(this->super_QEasingCurveFunction)._bezierCurves.d.ptr[1].yp +
                              lVar9);
            pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
            (&pSVar5->p2y)[lVar7] = qVar2;
            qVar2 = *(qreal *)((long)&(this->super_QEasingCurveFunction)._bezierCurves.d.ptr[2].xp +
                              lVar9);
            pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
            (&pSVar5->p3x)[lVar7] = qVar2;
            uVar1 = *(undefined8 *)
                     ((long)&(this->super_QEasingCurveFunction)._bezierCurves.d.ptr[2].yp + lVar9);
            uVar10 = (undefined4)uVar1;
            uVar11 = (undefined4)((ulong)uVar1 >> 0x20);
          }
          pSVar5 = QList<BezierEase::SingleCubicBezier>::data(this_00);
          (&pSVar5->p3y)[lVar7] = (qreal)CONCAT44(uVar11,uVar10);
        }
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 8;
        lVar9 = lVar9 + 0x30;
      } while ((long)uVar8 < (long)this->_curveCount);
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
  }
  this->_valid = bVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void init()
    {
        if (_bezierCurves.constLast() == QPointF(1.0, 1.0)) {
            _init = true;
            _curveCount = _bezierCurves.size() / 3;

            for (int i=0; i < _curveCount; i++) {
                _intervals[i] = _bezierCurves.at(i * 3 + 2).x();

                if (i == 0) {
                    _curves[0].p0x = 0.0;
                    _curves[0].p0y = 0.0;

                    _curves[0].p1x = _bezierCurves.at(0).x();
                    _curves[0].p1y = _bezierCurves.at(0).y();

                    _curves[0].p2x = _bezierCurves.at(1).x();
                    _curves[0].p2y = _bezierCurves.at(1).y();

                    _curves[0].p3x = _bezierCurves.at(2).x();
                    _curves[0].p3y = _bezierCurves.at(2).y();

                } else if (i == (_curveCount - 1)) {
                    _curves[i].p0x = _bezierCurves.at(_bezierCurves.size() - 4).x();
                    _curves[i].p0y = _bezierCurves.at(_bezierCurves.size() - 4).y();

                    _curves[i].p1x = _bezierCurves.at(_bezierCurves.size() - 3).x();
                    _curves[i].p1y = _bezierCurves.at(_bezierCurves.size() - 3).y();

                    _curves[i].p2x = _bezierCurves.at(_bezierCurves.size() - 2).x();
                    _curves[i].p2y = _bezierCurves.at(_bezierCurves.size() - 2).y();

                    _curves[i].p3x = _bezierCurves.at(_bezierCurves.size() - 1).x();
                    _curves[i].p3y = _bezierCurves.at(_bezierCurves.size() - 1).y();
                } else {
                    _curves[i].p0x = _bezierCurves.at(i * 3 - 1).x();
                    _curves[i].p0y = _bezierCurves.at(i * 3 - 1).y();

                    _curves[i].p1x = _bezierCurves.at(i * 3).x();
                    _curves[i].p1y = _bezierCurves.at(i * 3).y();

                    _curves[i].p2x = _bezierCurves.at(i * 3 + 1).x();
                    _curves[i].p2y = _bezierCurves.at(i * 3 + 1).y();

                    _curves[i].p3x = _bezierCurves.at(i * 3 + 2).x();
                    _curves[i].p3y = _bezierCurves.at(i * 3 + 2).y();
                }
            }
            _valid = true;
        } else {
            _valid = false;
        }
    }